

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgtypes.c
# Opt level: O0

CharList * pkg_prependToList(CharList *l,char *str)

{
  CharList *newList;
  char *str_local;
  CharList *l_local;
  
  l_local = (CharList *)uprv_malloc_63(0x10);
  if (l_local == (CharList *)0x0) {
    l_local = (CharList *)0x0;
  }
  else {
    l_local->str = str;
    l_local->next = l;
  }
  return l_local;
}

Assistant:

CharList *pkg_prependToList(CharList *l, const char *str)
{
  CharList *newList;
  newList = uprv_malloc(sizeof(CharList));

  /* test for NULL */
  if(newList == NULL) {
    return NULL;
  }

  newList->str = str;
  newList->next = l;
  return newList;
}